

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::SELU_x86_avx512::forward_inplace(SELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  undefined1 (*pauVar18) [64];
  long lVar19;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar20 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined4 uVar38;
  float fVar39;
  undefined1 extraout_var [60];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  float afVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  float afVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar63 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar24 [16];
  undefined1 auVar33 [32];
  
  iVar9 = bottom_top_blob->c;
  if (0 < (long)iVar9) {
    uVar17 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    auVar35 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar36 = vxorps_avx512dq(auVar35,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar35 = vxorps_avx512dq(auVar35,(undefined1  [64])::_ps512_cephes_exp_C2);
    lVar19 = 0;
    auVar37 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    auVar20 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
    auVar63 = ZEXT1664(auVar20);
    auVar20 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
    auVar64 = ZEXT1664(auVar20);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
    auVar65 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
    auVar66 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar67 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
    auVar68 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar70 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
    auVar71 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
    auVar72 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar73 = ZEXT3264(auVar28);
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar74 = ZEXT3264(auVar28);
    auVar42 = ZEXT3264(CONCAT428(0x3c088908,
                                 CONCAT424(0x3c088908,
                                           CONCAT420(0x3c088908,
                                                     CONCAT416(0x3c088908,
                                                               CONCAT412(0x3c088908,
                                                                         CONCAT48(0x3c088908,
                                                                                  0x3c0889083c088908
                                                                                 )))))));
    auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar61 = ZEXT3264(auVar28);
    auVar28 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    auVar62 = ZEXT3264(auVar28);
    auVar41 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar43 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
    auVar47 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    auVar49 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar53 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
    auVar55 = ZEXT1664(CONCAT412(0x395e8083,CONCAT48(0x395e8083,0x395e8083395e8083)));
    auVar51 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
    auVar54 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
    auVar56 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
    auVar58 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
    auVar59 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
    auVar20 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    auVar60 = ZEXT1664(auVar20);
    afVar50 = ::_ps512_1;
    afVar57 = ::_ps512_cephes_exp_p5;
    do {
      pauVar18 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar19 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      uVar1 = (this->super_SELU).alpha;
      uVar5 = (this->super_SELU).lambda;
      auVar20._4_4_ = uVar5;
      auVar20._0_4_ = uVar1;
      auVar20._8_8_ = 0;
      if ((int)uVar17 < 0x10) {
        uVar15 = 0;
      }
      else {
        auVar41 = vbroadcastss_avx512f(auVar20);
        auVar20 = vmovshdup_avx(auVar20);
        auVar42 = vbroadcastsd_avx512f(auVar20);
        iVar13 = 0xf;
        do {
          auVar43 = vmaxps_avx512f(*pauVar18,auVar63);
          auVar46 = vminps_avx512f(*pauVar18,auVar63);
          auVar46 = vminps_avx512f(auVar46,(undefined1  [64])::_ps512_exp_hi);
          auVar46 = vmaxps_avx512f(auVar46,(undefined1  [64])::_ps512_exp_lo);
          auVar47 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar46,
                                        (undefined1  [64])afVar57);
          auVar49 = vrndscaleps_avx512f(auVar47,1);
          uVar12 = vcmpps_avx512f(auVar47,auVar49,1);
          auVar47 = vsubps_avx512f(auVar49,(undefined1  [64])afVar50);
          bVar10 = (bool)((byte)uVar12 & 1);
          auVar59._0_4_ = (uint)bVar10 * auVar47._0_4_ | (uint)!bVar10 * auVar49._0_4_;
          bVar10 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar59._4_4_ = (uint)bVar10 * auVar47._4_4_ | (uint)!bVar10 * auVar49._4_4_;
          bVar10 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar59._8_4_ = (uint)bVar10 * auVar47._8_4_ | (uint)!bVar10 * auVar49._8_4_;
          bVar10 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar59._12_4_ = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * auVar49._12_4_;
          bVar10 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar59._16_4_ = (uint)bVar10 * auVar47._16_4_ | (uint)!bVar10 * auVar49._16_4_;
          bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar59._20_4_ = (uint)bVar10 * auVar47._20_4_ | (uint)!bVar10 * auVar49._20_4_;
          bVar10 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar59._24_4_ = (uint)bVar10 * auVar47._24_4_ | (uint)!bVar10 * auVar49._24_4_;
          bVar10 = (bool)((byte)(uVar12 >> 7) & 1);
          auVar59._28_4_ = (uint)bVar10 * auVar47._28_4_ | (uint)!bVar10 * auVar49._28_4_;
          bVar10 = (bool)((byte)(uVar12 >> 8) & 1);
          auVar59._32_4_ = (uint)bVar10 * auVar47._32_4_ | (uint)!bVar10 * auVar49._32_4_;
          bVar10 = (bool)((byte)(uVar12 >> 9) & 1);
          auVar59._36_4_ = (uint)bVar10 * auVar47._36_4_ | (uint)!bVar10 * auVar49._36_4_;
          bVar10 = (bool)((byte)(uVar12 >> 10) & 1);
          auVar59._40_4_ = (uint)bVar10 * auVar47._40_4_ | (uint)!bVar10 * auVar49._40_4_;
          bVar10 = (bool)((byte)(uVar12 >> 0xb) & 1);
          auVar59._44_4_ = (uint)bVar10 * auVar47._44_4_ | (uint)!bVar10 * auVar49._44_4_;
          bVar10 = (bool)((byte)(uVar12 >> 0xc) & 1);
          auVar59._48_4_ = (uint)bVar10 * auVar47._48_4_ | (uint)!bVar10 * auVar49._48_4_;
          bVar10 = (bool)((byte)(uVar12 >> 0xd) & 1);
          auVar59._52_4_ = (uint)bVar10 * auVar47._52_4_ | (uint)!bVar10 * auVar49._52_4_;
          bVar10 = (bool)((byte)(uVar12 >> 0xe) & 1);
          auVar59._56_4_ = (uint)bVar10 * auVar47._56_4_ | (uint)!bVar10 * auVar49._56_4_;
          bVar10 = SUB81(uVar12 >> 0xf,0);
          auVar59._60_4_ = (uint)bVar10 * auVar47._60_4_ | (uint)!bVar10 * auVar49._60_4_;
          auVar46 = vfmadd231ps_avx512f(auVar46,auVar59,auVar36);
          auVar46 = vfmadd231ps_avx512f(auVar46,auVar59,auVar35);
          auVar47 = vmulps_avx512f(auVar46,auVar46);
          auVar49 = vfmadd132ps_avx512f(auVar46,(undefined1  [64])::_ps512_cephes_exp_p1,
                                        (undefined1  [64])::_ps512_cephes_exp_p0);
          auVar49 = vfmadd213ps_avx512f(auVar49,auVar46,(undefined1  [64])::_ps512_cephes_exp_p2);
          auVar49 = vfmadd213ps_avx512f(auVar49,auVar46,(undefined1  [64])::_ps512_cephes_exp_p3);
          auVar49 = vfmadd213ps_avx512f(auVar49,auVar46,(undefined1  [64])::_ps512_cephes_exp_p4);
          auVar49 = vfmadd213ps_avx512f(auVar49,auVar46,(undefined1  [64])afVar57);
          auVar46 = vfmadd213ps_avx512f(auVar49,auVar47,auVar46);
          auVar46 = vaddps_avx512f(auVar46,(undefined1  [64])afVar50);
          auVar47 = vcvttps2dq_avx512f(auVar59);
          auVar47 = vpaddd_avx512f(auVar47,(undefined1  [64])::_pi32_512_0x7f);
          auVar47 = vpslld_avx512f(auVar47,0x17);
          auVar46 = vfmadd213ps_avx512f(auVar47,auVar46,auVar37);
          auVar43 = vfmadd213ps_avx512f(auVar46,auVar41,auVar43);
          auVar43 = vmulps_avx512f(auVar43,auVar42);
          *pauVar18 = auVar43;
          pauVar18 = pauVar18 + 1;
          iVar13 = iVar13 + 0x10;
        } while (iVar13 < (int)uVar17);
        uVar2 = (this->super_SELU).alpha;
        uVar6 = (this->super_SELU).lambda;
        auVar20._4_4_ = uVar6;
        auVar20._0_4_ = uVar2;
        auVar20._8_8_ = 0;
        auVar42 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar43 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar47 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar49 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar59 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
        auVar41 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        uVar15 = uVar17 & 0xfffffff0;
      }
      if ((int)(uVar15 | 7) < (int)uVar17) {
        uVar38 = auVar20._0_4_;
        auVar40._4_4_ = uVar38;
        auVar40._0_4_ = uVar38;
        auVar40._8_4_ = uVar38;
        auVar40._12_4_ = uVar38;
        auVar40._16_4_ = uVar38;
        auVar40._20_4_ = uVar38;
        auVar40._24_4_ = uVar38;
        auVar40._28_4_ = uVar38;
        auVar20 = vmovshdup_avx(auVar20);
        auVar52._8_4_ = 0x3d2aa9c1;
        auVar52._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar52._12_4_ = 0x3d2aa9c1;
        auVar52._16_4_ = 0x3d2aa9c1;
        auVar52._20_4_ = 0x3d2aa9c1;
        auVar52._24_4_ = 0x3d2aa9c1;
        auVar52._28_4_ = 0x3d2aa9c1;
        auVar28 = vmovdqa64_avx512vl(auVar62._0_32_);
        uVar14 = uVar15;
        do {
          auVar29 = vmaxps_avx512vl(*(undefined1 (*) [32])*pauVar18,auVar64._0_32_);
          auVar30 = vminps_avx512vl(*(undefined1 (*) [32])*pauVar18,auVar64._0_32_);
          auVar30 = vminps_avx512vl(auVar30,auVar65._0_32_);
          auVar31 = vmaxps_avx512vl(auVar30,auVar66._0_32_);
          auVar32 = vfmadd231ps_avx512vl(auVar67._0_32_,auVar31,auVar68._0_32_);
          auVar30 = vroundps_avx(auVar32,1);
          uVar12 = vcmpps_avx512vl(auVar32,auVar30,1);
          auVar69 = auVar70._0_32_;
          auVar33 = vsubps_avx512vl(auVar30,auVar69);
          bVar10 = (bool)((byte)uVar12 & 1);
          auVar34._0_4_ = (float)((uint)bVar10 * auVar33._0_4_ | (uint)!bVar10 * auVar30._0_4_);
          bVar10 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar34._4_4_ = (float)((uint)bVar10 * auVar33._4_4_ | (uint)!bVar10 * auVar30._4_4_);
          bVar10 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar34._8_4_ = (float)((uint)bVar10 * auVar33._8_4_ | (uint)!bVar10 * auVar30._8_4_);
          bVar10 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar34._12_4_ = (float)((uint)bVar10 * auVar33._12_4_ | (uint)!bVar10 * auVar30._12_4_);
          bVar10 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar34._16_4_ = (float)((uint)bVar10 * auVar33._16_4_ | (uint)!bVar10 * auVar30._16_4_);
          bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar34._20_4_ = (float)((uint)bVar10 * auVar33._20_4_ | (uint)!bVar10 * auVar30._20_4_);
          bVar10 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar34._24_4_ = (float)((uint)bVar10 * auVar33._24_4_ | (uint)!bVar10 * auVar30._24_4_);
          bVar10 = SUB81(uVar12 >> 7,0);
          auVar34._28_4_ = (float)((uint)bVar10 * auVar33._28_4_ | (uint)!bVar10 * auVar30._28_4_);
          auVar30 = vfmsub231ps_avx512vl(auVar31,auVar34,auVar71._0_32_);
          auVar31 = vfmsub231ps_avx512vl(auVar30,auVar34,auVar72._0_32_);
          auVar30._4_4_ = auVar31._4_4_ * auVar31._4_4_;
          auVar30._0_4_ = auVar31._0_4_ * auVar31._0_4_;
          auVar30._8_4_ = auVar31._8_4_ * auVar31._8_4_;
          auVar30._12_4_ = auVar31._12_4_ * auVar31._12_4_;
          auVar30._16_4_ = auVar31._16_4_ * auVar31._16_4_;
          auVar30._20_4_ = auVar31._20_4_ * auVar31._20_4_;
          auVar30._24_4_ = auVar31._24_4_ * auVar31._24_4_;
          auVar30._28_4_ = auVar32._28_4_;
          auVar32 = vfmadd213ps_avx512vl(auVar73._0_32_,auVar31,auVar74._0_32_);
          auVar21 = vfmadd213ps_fma(auVar32,auVar31,auVar42._0_32_);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar31,auVar52);
          auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar31,auVar61._0_32_);
          auVar32 = vfmadd213ps_avx512vl(ZEXT1632(auVar21),auVar31,auVar67._0_32_);
          auVar21 = vfmadd213ps_fma(auVar32,auVar30,auVar31);
          auVar31 = vaddps_avx512vl(ZEXT1632(auVar21),auVar69);
          auVar32._0_4_ = (int)auVar34._0_4_;
          auVar32._4_4_ = (int)auVar34._4_4_;
          auVar32._8_4_ = (int)auVar34._8_4_;
          auVar32._12_4_ = (int)auVar34._12_4_;
          auVar32._16_4_ = (int)auVar34._16_4_;
          auVar32._20_4_ = (int)auVar34._20_4_;
          auVar32._24_4_ = (int)auVar34._24_4_;
          auVar32._28_4_ = (int)auVar34._28_4_;
          auVar30 = vpslld_avx2(auVar32,0x17);
          auVar30 = vpaddd_avx2(auVar28,auVar30);
          auVar30 = vfmsub213ps_avx512vl(auVar30,auVar31,auVar69);
          auVar21 = vfmadd213ps_fma(auVar30,auVar40,auVar29);
          fVar39 = auVar20._0_4_;
          fVar11 = auVar20._4_4_;
          *(float *)*pauVar18 = auVar21._0_4_ * fVar39;
          *(float *)(*pauVar18 + 4) = auVar21._4_4_ * fVar11;
          *(float *)(*pauVar18 + 8) = auVar21._8_4_ * fVar39;
          *(float *)(*pauVar18 + 0xc) = auVar21._12_4_ * fVar11;
          *(float *)(*pauVar18 + 0x10) = fVar39 * 0.0;
          *(float *)(*pauVar18 + 0x14) = fVar11 * 0.0;
          *(float *)(*pauVar18 + 0x18) = fVar39 * 0.0;
          *(int *)(*pauVar18 + 0x1c) = auVar31._28_4_;
          pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x20);
          uVar15 = uVar14 + 8;
          iVar13 = uVar14 + 0xf;
          uVar14 = uVar15;
        } while (iVar13 < (int)uVar17);
        uVar3 = (this->super_SELU).alpha;
        uVar7 = (this->super_SELU).lambda;
        auVar20._4_4_ = uVar7;
        auVar20._0_4_ = uVar3;
        auVar20._8_8_ = 0;
        auVar42 = ZEXT3264(auVar42._0_32_);
        auVar61 = ZEXT3264(auVar61._0_32_);
        auVar28 = vmovdqa64_avx512vl(auVar28);
        auVar62 = ZEXT3264(auVar28);
        auVar41 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
        auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar43 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar47 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar49 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar53 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar55 = ZEXT1664(CONCAT412(0x395e8083,CONCAT48(0x395e8083,0x395e8083395e8083)));
        auVar51 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar54 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
      }
      if ((int)(uVar15 | 3) < (int)uVar17) {
        uVar38 = auVar20._0_4_;
        auVar27._4_4_ = uVar38;
        auVar27._0_4_ = uVar38;
        auVar27._8_4_ = uVar38;
        auVar27._12_4_ = uVar38;
        auVar20 = vshufps_avx(auVar20,auVar20,0x55);
        auVar21 = vxorps_avx512vl(auVar61._0_16_,auVar61._0_16_);
        auVar26 = auVar43._0_16_;
        uVar14 = uVar15;
        do {
          auVar22 = vmaxps_avx512vl(*(undefined1 (*) [16])*pauVar18,auVar21);
          auVar23 = vminps_avx512vl(*(undefined1 (*) [16])*pauVar18,auVar21);
          auVar23 = vminps_avx512vl(auVar23,auVar41._0_16_);
          auVar45 = vmaxps_avx(auVar23,auVar46._0_16_);
          auVar24 = vfmadd231ps_fma(auVar26,auVar45,auVar47._0_16_);
          auVar23._0_4_ = (int)auVar24._0_4_;
          auVar23._4_4_ = (int)auVar24._4_4_;
          auVar23._8_4_ = (int)auVar24._8_4_;
          auVar23._12_4_ = (int)auVar24._12_4_;
          auVar23 = vcvtdq2ps_avx(auVar23);
          uVar12 = vcmpps_avx512vl(auVar24,auVar23,1);
          auVar24 = vsubps_avx512vl(auVar23,auVar49._0_16_);
          bVar10 = (bool)((byte)uVar12 & 1);
          auVar25._0_4_ = (float)((uint)bVar10 * auVar24._0_4_ | (uint)!bVar10 * auVar23._0_4_);
          bVar10 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar25._4_4_ = (float)((uint)bVar10 * auVar24._4_4_ | (uint)!bVar10 * auVar23._4_4_);
          bVar10 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar25._8_4_ = (float)((uint)bVar10 * auVar24._8_4_ | (uint)!bVar10 * auVar23._8_4_);
          bVar10 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar25._12_4_ = (float)((uint)bVar10 * auVar24._12_4_ | (uint)!bVar10 * auVar23._12_4_);
          auVar23 = vfmsub231ps_fma(auVar45,auVar25,auVar53._0_16_);
          auVar45 = vfmsub231ps_fma(auVar23,auVar25,auVar55._0_16_);
          auVar24._0_4_ = auVar45._0_4_ * auVar45._0_4_;
          auVar24._4_4_ = auVar45._4_4_ * auVar45._4_4_;
          auVar24._8_4_ = auVar45._8_4_ * auVar45._8_4_;
          auVar24._12_4_ = auVar45._12_4_ * auVar45._12_4_;
          auVar23 = vfmadd213ps_avx512vl(auVar51._0_16_,auVar45,auVar54._0_16_);
          auVar23 = vfmadd213ps_fma(auVar23,auVar45,auVar56._0_16_);
          auVar23 = vfmadd213ps_fma(auVar23,auVar45,auVar58._0_16_);
          auVar23 = vfmadd213ps_fma(auVar23,auVar45,auVar59._0_16_);
          auVar23 = vfmadd213ps_fma(auVar23,auVar45,auVar26);
          auVar23 = vfmadd213ps_fma(auVar23,auVar24,auVar45);
          auVar45._8_4_ = 0x3f800000;
          auVar45._0_8_ = 0x3f8000003f800000;
          auVar45._12_4_ = 0x3f800000;
          auVar23 = vaddps_avx512vl(auVar23,auVar45);
          auVar48._8_4_ = 0x3f800000;
          auVar48._0_8_ = 0x3f8000003f800000;
          auVar48._12_4_ = 0x3f800000;
          auVar49 = ZEXT1664(auVar48);
          auVar44._0_4_ = (int)auVar25._0_4_;
          auVar44._4_4_ = (int)auVar25._4_4_;
          auVar44._8_4_ = (int)auVar25._8_4_;
          auVar44._12_4_ = (int)auVar25._12_4_;
          auVar47 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
          auVar45 = vpslld_avx(auVar44,0x17);
          auVar45 = vpaddd_avx512vl(auVar45,auVar60._0_16_);
          auVar23 = vfmsub213ps_fma(auVar45,auVar23,auVar48);
          auVar23 = vfmadd213ps_fma(auVar23,auVar27,auVar22);
          auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
          *(float *)*pauVar18 = auVar23._0_4_ * auVar20._0_4_;
          *(float *)(*pauVar18 + 4) = auVar23._4_4_ * auVar20._4_4_;
          *(float *)(*pauVar18 + 8) = auVar23._8_4_ * auVar20._8_4_;
          *(float *)(*pauVar18 + 0xc) = auVar23._12_4_ * auVar20._12_4_;
          pauVar18 = (undefined1 (*) [64])(*pauVar18 + 0x10);
          uVar15 = uVar14 + 4;
          iVar13 = uVar14 + 7;
          uVar14 = uVar15;
        } while (iVar13 < (int)uVar17);
        uVar4 = (this->super_SELU).alpha;
        uVar8 = (this->super_SELU).lambda;
        auVar20._4_4_ = uVar8;
        auVar20._0_4_ = uVar4;
        auVar20._8_8_ = 0;
        auVar42 = ZEXT3264(CONCAT428(0x3c088908,
                                     CONCAT424(0x3c088908,
                                               CONCAT420(0x3c088908,
                                                         CONCAT416(0x3c088908,
                                                                   CONCAT412(0x3c088908,
                                                                             CONCAT48(0x3c088908,
                                                                                                                                                                            
                                                  0x3c0889083c088908)))))));
        auVar43 = ZEXT1664(auVar26);
        auVar53 = ZEXT1664(auVar53._0_16_);
        auVar55 = ZEXT1664(auVar55._0_16_);
        auVar54 = ZEXT1664(auVar54._0_16_);
        auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar61 = ZEXT3264(auVar28);
        auVar28 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar62 = ZEXT3264(auVar28);
        auVar41 = ZEXT1664(auVar41._0_16_);
      }
      if (uVar17 - uVar15 != 0 && (int)uVar15 <= (int)uVar17) {
        auVar21 = vmovshdup_avx(auVar20);
        auVar41 = ZEXT1664(auVar41._0_16_);
        lVar16 = 0;
        do {
          auVar27 = auVar63._0_16_;
          auVar23 = auVar64._0_16_;
          auVar26 = auVar41._0_16_;
          fVar39 = *(float *)(*pauVar18 + lVar16 * 4);
          if (0.0 <= fVar39) {
            fVar39 = fVar39 * (this->super_SELU).lambda;
          }
          else {
            auVar41._0_4_ = expf(fVar39);
            auVar41._4_60_ = extraout_var;
            auVar26 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar60 = ZEXT1664(auVar26);
            auVar59 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
            auVar58 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
            auVar56 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
            auVar49 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar47 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
            auVar43 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
            auVar46 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
            auVar26._8_4_ = 0x42b0c0a5;
            auVar26._0_8_ = 0x42b0c0a542b0c0a5;
            auVar26._12_4_ = 0x42b0c0a5;
            auVar28 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar62 = ZEXT3264(auVar28);
            auVar55 = ZEXT1664(CONCAT412(0x395e8083,CONCAT48(0x395e8083,0x395e8083395e8083)));
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar61 = ZEXT3264(auVar28);
            auVar54 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
            auVar51 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
            auVar53 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
            auVar42 = ZEXT3264(CONCAT428(0x3c088908,
                                         CONCAT424(0x3c088908,
                                                   CONCAT420(0x3c088908,
                                                             CONCAT416(0x3c088908,
                                                                       CONCAT412(0x3c088908,
                                                                                 CONCAT48(0x3c088908
                                                                                          ,
                                                  0x3c0889083c088908)))))));
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar74 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar73 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
            auVar72 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar71 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar70 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar68 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar67 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar66 = ZEXT3264(auVar28);
            auVar28 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar65 = ZEXT3264(auVar28);
            auVar23 = vxorps_avx512vl(auVar23,auVar23);
            auVar64 = ZEXT1664(auVar23);
            auVar27 = vxorps_avx512vl(auVar27,auVar27);
            auVar63 = ZEXT1664(auVar27);
            auVar37 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
            auVar27 = ZEXT416((uint)(auVar21._0_4_ * auVar20._0_4_));
            auVar27 = vfmsub213ss_avx512f(auVar41._0_16_,auVar27,auVar27);
            fVar39 = auVar27._0_4_;
            afVar50 = ::_ps512_1;
            afVar57 = ::_ps512_cephes_exp_p5;
          }
          auVar41 = ZEXT1664(auVar26);
          *(float *)(*pauVar18 + lVar16 * 4) = fVar39;
          lVar16 = lVar16 + 1;
        } while (uVar17 - uVar15 != (int)lVar16);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != iVar9);
  }
  return 0;
}

Assistant:

int SELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}